

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode output_auth_headers(connectdata *conn,auth *authstatus,char *request,char *path,_Bool proxy
                            )

{
  Curl_easy *data;
  unsigned_long uVar1;
  Curl_easy *data_00;
  size_t sVar2;
  CURLcode CVar3;
  long lVar4;
  size_t insize;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  size_t maxlength;
  char *pcVar8;
  char **ppcVar9;
  char *local_48;
  long local_40;
  size_t size;
  
  data = conn->data;
  uVar1 = authstatus->picked;
  if (uVar1 == 1) {
    if (proxy) {
      if (((conn->bits).proxy_user_passwd == true) &&
         (pcVar5 = Curl_checkProxyheaders(conn,"Proxy-authorization:"), pcVar5 == (char *)0x0)) {
        local_40 = 0x400;
        lVar4 = 0x168;
        lVar6 = 0x170;
LAB_00110463:
        size = 0;
        local_48 = (char *)0x0;
        data_00 = conn->data;
        sVar2 = (data_00->set).buffer_size;
        maxlength = 0x4000;
        if (sVar2 != 0) {
          maxlength = sVar2;
        }
        curl_msnprintf((data_00->state).buffer,maxlength,"%s:%s",
                       *(undefined8 *)((conn->chunk).hexbuffer + lVar4 + -8),
                       *(undefined8 *)((conn->chunk).hexbuffer + lVar6 + -8));
        pcVar5 = (data_00->state).buffer;
        insize = strlen(pcVar5);
        CVar3 = Curl_base64_encode(data_00,pcVar5,insize,&local_48,&size);
        lVar4 = local_40;
        if (CVar3 != CURLE_OK) {
          return CVar3;
        }
        if (local_48 == (char *)0x0) {
          return CURLE_REMOTE_ACCESS_DENIED;
        }
        (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + local_40 + -8));
        pcVar5 = "";
        if (proxy) {
          pcVar5 = "Proxy-";
        }
        pcVar5 = curl_maprintf("%sAuthorization: Basic %s\r\n",pcVar5,local_48);
        *(char **)((conn->chunk).hexbuffer + lVar4 + -8) = pcVar5;
        (*Curl_cfree)(local_48);
        if (*(long *)((conn->chunk).hexbuffer + lVar4 + -8) == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
        authstatus->done = true;
        pcVar5 = "Basic";
        goto LAB_001103e9;
      }
    }
    else if (((conn->bits).user_passwd == true) &&
            (pcVar5 = Curl_checkheaders(conn,"Authorization:"), pcVar5 == (char *)0x0)) {
      local_40 = 0x418;
      lVar4 = 0x1f8;
      lVar6 = 0x200;
      goto LAB_00110463;
    }
    authstatus->done = true;
LAB_001103d9:
    authstatus->multi = false;
  }
  else {
    if (uVar1 == 2) {
      CVar3 = Curl_output_digest(conn,proxy,(uchar *)request,(uchar *)path);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      pcVar5 = "Digest";
    }
    else {
      if (uVar1 != 8) goto LAB_001103d9;
      CVar3 = Curl_output_ntlm(conn,proxy);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      pcVar5 = "NTLM";
    }
LAB_001103e9:
    pcVar7 = "Server";
    ppcVar9 = &conn->user;
    if (proxy) {
      pcVar7 = "Proxy";
      ppcVar9 = &(conn->http_proxy).user;
    }
    pcVar8 = "";
    if (*ppcVar9 != (char *)0x0) {
      pcVar8 = *ppcVar9;
    }
    Curl_infof(data,"%s auth using %s with user \'%s\'\n",pcVar7,pcVar5,pcVar8);
    authstatus->multi = (_Bool)(authstatus->done ^ 1);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode
output_auth_headers(struct connectdata *conn,
                    struct auth *authstatus,
                    const char *request,
                    const char *path,
                    bool proxy)
{
  const char *auth = NULL;
  CURLcode result = CURLE_OK;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS) || defined(USE_SPNEGO)
  struct Curl_easy *data = conn->data;
#endif
#ifdef USE_SPNEGO
  struct negotiatedata *negdata = proxy ?
    &data->state.proxyneg : &data->state.negotiate;
#endif

#ifdef CURL_DISABLE_CRYPTO_AUTH
  (void)request;
  (void)path;
#endif

#ifdef USE_SPNEGO
  negdata->state = GSS_AUTHNONE;
  if((authstatus->picked == CURLAUTH_NEGOTIATE) &&
     negdata->context && !GSS_ERROR(negdata->status)) {
    auth = "Negotiate";
    result = Curl_output_negotiate(conn, proxy);
    if(result)
      return result;
    authstatus->done = TRUE;
    negdata->state = GSS_AUTHSENT;
  }
  else
#endif
#ifdef USE_NTLM
  if(authstatus->picked == CURLAUTH_NTLM) {
    auth = "NTLM";
    result = Curl_output_ntlm(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#if defined(USE_NTLM) && defined(NTLM_WB_ENABLED)
  if(authstatus->picked == CURLAUTH_NTLM_WB) {
    auth="NTLM_WB";
    result = Curl_output_ntlm_wb(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
  if(authstatus->picked == CURLAUTH_DIGEST) {
    auth = "Digest";
    result = Curl_output_digest(conn,
                                proxy,
                                (const unsigned char *)request,
                                (const unsigned char *)path);
    if(result)
      return result;
  }
  else
#endif
  if(authstatus->picked == CURLAUTH_BASIC) {
    /* Basic */
    if((proxy && conn->bits.proxy_user_passwd &&
        !Curl_checkProxyheaders(conn, "Proxy-authorization:")) ||
       (!proxy && conn->bits.user_passwd &&
        !Curl_checkheaders(conn, "Authorization:"))) {
      auth = "Basic";
      result = http_output_basic(conn, proxy);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }

  if(auth) {
    infof(data, "%s auth using %s with user '%s'\n",
          proxy ? "Proxy" : "Server", auth,
          proxy ? (conn->http_proxy.user ? conn->http_proxy.user : "") :
                  (conn->user ? conn->user : ""));
    authstatus->multi = (!authstatus->done) ? TRUE : FALSE;
  }
  else
    authstatus->multi = FALSE;

  return CURLE_OK;
}